

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::PlatformIsx32(cmMakefile *this)

{
  int *piVar1;
  bool bVar2;
  cmValue cVar3;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"CMAKE_INTERNAL_PLATFORM_ABI","");
  cVar3 = GetDefinition(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (((cVar3.Value == (string *)0x0) || ((cVar3.Value)->_M_string_length != 7)) ||
     (piVar1 = (int *)((cVar3.Value)->_M_dataplus)._M_p,
     *(int *)((long)piVar1 + 3) != 0x32335820 || *piVar1 != 0x20464c45)) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool cmMakefile::PlatformIsx32() const
{
  if (cmValue plat_abi = this->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI")) {
    if (*plat_abi == "ELF X32"_s) {
      return true;
    }
  }
  return false;
}